

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  TriggerStep *pTVar1;
  Upsert *pUVar2;
  TriggerStep **ppTVar3;
  Upsert *pUpsert;
  
  sqlite3WalkExpr(pWalker,pTrigger->pWhen);
  ppTVar3 = &pTrigger->step_list;
  while (pTVar1 = *ppTVar3, pTVar1 != (TriggerStep *)0x0) {
    sqlite3WalkSelect(pWalker,pTVar1->pSelect);
    sqlite3WalkExpr(pWalker,pTVar1->pWhere);
    sqlite3WalkExprList(pWalker,pTVar1->pExprList);
    pUVar2 = pTVar1->pUpsert;
    if (pUVar2 != (Upsert *)0x0) {
      sqlite3WalkExprList(pWalker,pUVar2->pUpsertTarget);
      sqlite3WalkExprList(pWalker,pUVar2->pUpsertSet);
      sqlite3WalkExpr(pWalker,pUVar2->pUpsertWhere);
      sqlite3WalkExpr(pWalker,pUVar2->pUpsertTargetWhere);
    }
    ppTVar3 = &pTVar1->pNext;
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
  }
}